

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void __thiscall CVmObjBigNum::set_ieee754_value(CVmObjBigNum *this,char *buf,int bits)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ieee754 *in_RDI;
  char *ttmp;
  int i;
  int e;
  char *ln2;
  char *t3;
  char t3buf [42];
  char *t2;
  char t2buf [42];
  char t1 [42];
  int prec;
  ieee754 val;
  long in_stack_fffffffffffffed8;
  unsigned_long *remp;
  ieee754 *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  unsigned_long *puVar5;
  undefined7 in_stack_ffffffffffffff19;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  unsigned_long *new_ext;
  undefined1 local_a8 [48];
  undefined1 local_78 [52];
  int local_44;
  ieee754 local_40;
  
  ieee754::ieee754((ieee754 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,(int)((ulong)in_RDI >> 0x20));
  iVar2 = ieee754::is_zero(&local_40);
  if (iVar2 == 0) {
    iVar2 = ieee754::is_nan(in_stack_fffffffffffffee0);
    if (iVar2 == 0) {
      iVar2 = ieee754::is_infinity(in_stack_fffffffffffffee0);
      if (iVar2 == 0) {
        local_44 = ieee754::decimal_digits(&local_40);
        local_44 = local_44 + 2;
        memset(local_78,0,0x2a);
        local_78[0] = (undefined1)local_44;
        memset(local_a8,0,0x2a);
        local_a8[0] = (undefined1)local_44;
        new_ext = (unsigned_long *)local_a8;
        memset(&stack0xffffffffffffff18,0,0x2a);
        uVar1 = (undefined1)local_44;
        remp = (unsigned_long *)&stack0xffffffffffffff18;
        pcVar4 = cache_ln2((size_t)in_stack_fffffffffffffee8);
        iVar2 = ieee754::get_exp(in_stack_fffffffffffffee0);
        set_int_val((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        compute_prod_into((char *)new_ext,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        compute_exp_into((char *)val._16_8_,(char *)val._8_8_);
        if (local_40.emin + -1 < iVar2) {
          copy_val((char *)in_RDI,in_stack_fffffffffffffee8,
                   (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
        }
        else {
          set_zero((char *)in_stack_fffffffffffffee0);
          mul_by_long((char *)remp,(unsigned_long)pcVar4);
        }
        for (iVar2 = 0; iVar2 < local_40.mbits; iVar2 = iVar2 + 1) {
          div_by_long(in_stack_ffffffffffffff20,CONCAT71(in_stack_ffffffffffffff19,uVar1),remp);
          iVar3 = ieee754::get_mbit(in_RDI,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          puVar5 = remp;
          if (iVar3 != 0) {
            puVar5 = new_ext;
            compute_sum_into((char *)in_RDI,in_stack_fffffffffffffee8,
                             (char *)in_stack_fffffffffffffee0);
            new_ext = remp;
          }
          remp = puVar5;
        }
        iVar2 = ieee754::get_sign(&local_40);
        iVar3 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        set_neg((char *)remp,iVar2);
        normalize((char *)in_RDI);
        copy_val((char *)in_RDI,in_stack_fffffffffffffee8,iVar3);
      }
      else {
        set_type(*(char **)&in_RDI->mbits,4);
        pcVar4 = *(char **)&in_RDI->mbits;
        iVar2 = ieee754::get_sign(&local_40);
        set_neg(pcVar4,iVar2);
      }
    }
    else {
      set_type(*(char **)&in_RDI->mbits,2);
    }
  }
  else {
    set_zero((char *)in_stack_fffffffffffffee0);
    pcVar4 = *(char **)&in_RDI->mbits;
    iVar2 = ieee754::get_sign(&local_40);
    set_neg(pcVar4,iVar2);
  }
  return;
}

Assistant:

void CVmObjBigNum::set_ieee754_value(VMG_ const char *buf, int bits)
{
    /* set up the buffer descriptor */
    ieee754 val((char *)buf, bits);

    /* check for special values */
    if (val.is_zero())
    {
        set_zero(ext_);
        set_neg(ext_, val.get_sign());
        return;
    }
    else if (val.is_nan())
    {
        set_type(ext_, VMBN_T_NAN);
        return;
    }
    else if (val.is_infinity())
    {
        set_type(ext_, VMBN_T_INF);
        set_neg(ext_, val.get_sign());
        return;
    }

    /* 
     *   figure the precision for our intermediate calculations based on the
     *   precision of the source format in decimal digits 
     */
    int prec = val.decimal_digits() + 2;

    /* 
     *   Set up some registers for intermediate calculations.  We don't have
     *   to allocate these since we know the upper bound to the precision
     *   we'll need (namely 35+2 for the 128-bit type).  
     */
    char t1[5+37] = { (char)prec, 0, 0, 0, 0 };
    char t2buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t2 = t2buf;
    char t3buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t3 = t3buf;

    /*
     *   The IEEE value is represented as A * 2^B, for some non-zero value of
     *   A.  If the exponent is emin-1, A is represented as 0.bbbbb, where
     *   the b's are bits of the mantissa.  For any other exponent, A is
     *   represented as 1.bbbbb.  To compute our value, then, start with 2^B
     *   in register t1 and zero in the accumulator.  If the leading bit is 1
     *   (exponent >= emin), add r1 to the accumulator.  Divide t1 by 2 and
     *   loop: if the current bit is set, add t1 to the accumulator.  Repeat
     *   for each bit of the mantissa.  
     */
    
    /* calculate t1 = 2^B = e^(B*ln2) */
    const char *ln2 = cache_ln2(prec);
    int e = val.get_exp();
    set_int_val(t1, e);
    compute_prod_into(t2, t1, ln2);
    compute_exp_into(t1, t2);

    /* 
     *   If b > emin-1, there's an implied 1 bit for the whole part.  If b ==
     *   emin-1, we have a subnormal number, meaning that the implied lead
     *   bit is 0, and the actual exponent is val.emin.  
     */
    if (e > val.emin - 1)
    {
        /* normalized - add the implied leading "1" bit */
        copy_val(t3, t1, FALSE);
    }
    else
    {
        /* 
         *   subnormal - the implied leading bit is "0", but the actual
         *   exponent value is emin - one higher than it appears
         */
        set_zero(t3);
        mul_by_long(t1, 2);
    }

    /* add each bit of the mantissa */
    for (int i = 0 ; i < val.mbits ; ++i)
    {
        /* divide the power-of-two multiplier by 2 for the next lower place */
        div_by_long(t1, 2);

        /* if this mantissa bit is 1, add t1 to the accumulator */
        if (val.get_mbit(i))
        {
            /* t2 <- acc + power of two */
            compute_sum_into(t2, t3, t1);

            /* swap t2 and t3 so that t3 is the accumulator again */
            char *ttmp = t3; t3 = t2; t2 = ttmp;
        }
    }

    /* set the sign and normalize the value */
    set_neg(t3, val.get_sign());
    normalize(t3);

    /* copy the result into our extension */
    copy_val(ext_, t3, TRUE);
}